

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O2

string * __thiscall
iDynTree::Traversal::toString_abi_cxx11_
          (string *__return_storage_ptr__,Traversal *this,Model *model)

{
  int iVar1;
  ostream *poVar2;
  LinkIndex LVar3;
  undefined4 extraout_var;
  ulong uVar4;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"Traversal: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar4 = 0;
      uVar4 < ((ulong)((long)(this->links).
                             super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->links).
                            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
      uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<(local_1a8,"[");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"]\tLink: ");
    LVar3 = Link::getIndex((this->links).
                           super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    Model::getLinkName_abi_cxx11_(&local_1d8,model,LVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    poVar2 = std::operator<<(poVar2,"[");
    Link::getIndex((this->links).
                   super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar4 != 0) {
      poVar2 = std::operator<<(local_1a8,"\tJoint to parent : ");
      iVar1 = (*(this->toParentJoints).
                super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4]->_vptr_IJoint[0x14])();
      Model::getJointName_abi_cxx11_(&local_1d8,model,CONCAT44(extraout_var,iVar1));
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      poVar2 = std::operator<<(poVar2,"[");
      (*(this->toParentJoints).
        super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4]->_vptr_IJoint[0x14])();
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,"]");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_1d8);
      poVar2 = std::operator<<(local_1a8,"\tParent link     : ");
      LVar3 = Link::getIndex((this->parents).
                             super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      Model::getLinkName_abi_cxx11_(&local_1d8,model,LVar3);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      poVar2 = std::operator<<(poVar2,"[");
      Link::getIndex((this->parents).
                     super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,"]");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Traversal::toString(const Model & model) const
{
    std::stringstream ss;

    ss << "Traversal: " << std::endl;
    for(size_t i=0; i < this->getNrOfVisitedLinks(); i++ )
    {
        ss << "[" << i << "]\tLink: " << model.getLinkName(this->getLink(i)->getIndex()) << "[" << this->getLink(i)->getIndex() << "]" << std::endl;
        if( i > 0 )
        {
           ss << "\tJoint to parent : " << model.getJointName(this->getParentJoint(i)->getIndex()) << "[" << this->getParentJoint(i)->getIndex() << "]" << std::endl;
           ss << "\tParent link     : " << model.getLinkName(this->getParentLink(i)->getIndex()) << "[" << this->getParentLink(i)->getIndex() << "]" << std::endl;
        }
    }

    return ss.str();
}